

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O1

bool ON_BrepConeLoop(ON_Brep *brep,int loop_index,ON_3dPoint apex_point)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepEdge *pOVar4;
  ON_3dPoint vertex_point;
  ON_BrepFace *pOVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ON_NurbsSurface *pSurface;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int vid [4];
  int eid [4];
  undefined4 local_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined4 local_54;
  int local_50;
  int local_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  int iStack_3c;
  ON_BrepVertex *local_38;
  
  if ((loop_index < 0) &&
     ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      loop_index)) {
    local_54._0_1_ = 0;
  }
  else {
    pOVar2 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    uVar10 = pOVar2[loop_index].m_ti.m_count;
    uVar11 = (ulong)uVar10;
    local_54 = (undefined4)CONCAT71((int7)((ulong)pOVar2 >> 8),uVar11 != 0);
    if (uVar11 != 0) {
      local_50 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_count;
      local_4c = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                 m_count;
      ON_BrepExtrudeHelper_ReserveSpace(brep,uVar10,0);
      vertex_point.y = apex_point.y;
      vertex_point.x = apex_point.x;
      vertex_point.z = apex_point.z;
      local_38 = ON_Brep::NewVertex(brep,vertex_point,0.0);
      if (0 < (int)uVar10) {
        uVar10 = 0xffffffff;
        uVar9 = 0;
        uVar8 = 0xffffffff;
        do {
          iVar1 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
                  [loop_index].m_ti.m_a[uVar9];
          lVar6 = (long)iVar1;
          if ((-1 < lVar6) && (iVar1 < local_4c)) {
            local_68 = -1;
            iStack_64 = -1;
            iStack_60 = 0xffffffff;
            iStack_5c = 0xffffffff;
            local_48 = -1;
            iStack_44 = -1;
            uStack_40 = 0xffffffff;
            iStack_3c = -1;
            local_6c = 0;
            pOVar3 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            lVar7 = (long)pOVar3[lVar6].m_ei;
            if (lVar7 < 0) {
              pSurface = (ON_NurbsSurface *)0x0;
            }
            else {
              pSurface = (ON_NurbsSurface *)0x0;
              if (pOVar3[lVar6].m_ei < local_50) {
                pOVar4 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                         super_ON_ClassArray<ON_BrepEdge>.m_a;
                local_68 = pOVar3[lVar6].m_vi[1];
                iStack_64 = pOVar3[lVar6].m_vi[0];
                local_48 = pOVar4[lVar7].m_edge_index;
                local_6c = pOVar3[lVar6].m_bRev3d ^ 1;
                pSurface = ON_BrepExtrudeHelper_MakeConeSrf
                                     (&apex_point,pOVar4 + lVar7,(bool)(pOVar3[lVar6].m_bRev3d ^ 1))
                ;
              }
            }
            if (pSurface != (ON_NurbsSurface *)0x0) {
              iStack_5c = local_38->m_vertex_index;
              iStack_60 = iStack_5c;
              if (-1 < (int)uVar10) {
                pOVar3 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                iVar1 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                        super_ON_ClassArray<ON_BrepLoop>.m_a
                        [*(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                          super_ON_ClassArray<ON_BrepFace>.m_a[uVar10].m_li.m_a].m_ti.m_a[3];
                iStack_60 = pOVar3[iVar1].m_vi[0];
                iStack_44 = pOVar3[iVar1].m_ei;
                local_6c = CONCAT22(local_6c._2_2_,CONCAT11(pOVar3[iVar1].m_bRev3d,local_6c._0_1_))
                           ^ 0x100;
              }
              if (-1 < (int)uVar8) {
                pOVar3 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                if (pOVar3[uVar8].m_vi[0] == local_68) {
                  iStack_5c = pOVar3[uVar8].m_vi[1];
                  iStack_3c = pOVar3[uVar8].m_ei;
                  local_6c = CONCAT13(pOVar3[uVar8].m_bRev3d,(undefined3)local_6c) ^ 0x1000000;
                }
              }
              pOVar5 = ON_Brep::NewFace(brep,&pSurface->super_ON_Surface,&local_68,&local_48,
                                        (bool *)&local_6c);
              if (pOVar5 != (ON_BrepFace *)0x0) {
                uVar10 = pOVar5->m_face_index;
                if ((int)uVar8 < 0) {
                  uVar8 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                          super_ON_ClassArray<ON_BrepLoop>.m_a[*(pOVar5->m_li).m_a].m_ti.m_a[1];
                }
              }
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
    }
  }
  return (bool)(undefined1)local_54;
}

Assistant:

bool ON_BrepConeLoop( 
          ON_Brep& brep,
          int loop_index,
          ON_3dPoint apex_point
          )
{
  if ( loop_index < 0 && loop_index >= brep.m_L.Count() )
    return false;

  int lti, ti, i, vid[4], eid[4];
  bool bRev3d[4];

  // indices of new faces appended to the side_face_index[] array 
  // (1 face index for each trim, -1 is used for singular trims)

  // count number of new objects so we can grow arrays
  // efficiently and use refs to dynamic array elements.
  const int loop_trim_count = brep.m_L[loop_index].m_ti.Count();
  if ( loop_trim_count == 0 )
    return false;

  // save input trim and edge counts for use below
  const int trim_count0 = brep.m_T.Count();
  const int edge_count0 = brep.m_E.Count();

  ON_BrepExtrudeHelper_ReserveSpace( brep, loop_trim_count, 0 );

  int prev_face_index = -1;
  int first_face_east_trim_index = -1;

  ON_BrepVertex& apex_vertex = brep.NewVertex( apex_point, 0.0 );

  for ( lti = 0; lti < loop_trim_count; lti++ )
  {
    ON_NurbsSurface* cone_srf = 0;
    ti = brep.m_L[loop_index].m_ti[lti];
    if ( ti < 0 || ti >= trim_count0 )
      continue;

    for ( i = 0; i < 4; i++ )
    {
      vid[i] = -1;
      eid[i] = -1;
    }
    bRev3d[0] = false;
    bRev3d[1] = false;
    bRev3d[2] = false;
    bRev3d[3] = false;

    // get side surface for new face
    // get side surface for new face
    {
      ON_BrepTrim& trim = brep.m_T[ti];
      if ( trim.m_ei >= 0 &&  trim.m_ei < edge_count0 )
      {
        const ON_BrepEdge& base_edge = brep.m_E[trim.m_ei];

        // connect new face to existing topology on trim
        vid[0] = trim.m_vi[1];
        vid[1] = trim.m_vi[0];
        eid[0] = base_edge.m_edge_index;
        bRev3d[0] = (trim.m_bRev3d?false:true);
        cone_srf = ON_BrepExtrudeHelper_MakeConeSrf( apex_point, base_edge, bRev3d[0] );
      }
    }
    if ( !cone_srf )
      continue;
    vid[2] = apex_vertex.m_vertex_index;
    vid[3] = apex_vertex.m_vertex_index;

    if ( prev_face_index >= 0 )
    {
      const ON_BrepTrim& prev_west_trim = brep.m_T[ brep.m_L[ brep.m_F[prev_face_index].m_li[0]].m_ti[3] ];
      vid[2] = prev_west_trim.m_vi[0];
      eid[1] = prev_west_trim.m_ei;
      bRev3d[1] = (prev_west_trim.m_bRev3d?false:true);
    }
    if ( first_face_east_trim_index >= 0 && brep.m_T[first_face_east_trim_index].m_vi[0] == vid[0] )
    {
      const ON_BrepTrim& first_face_east_trim = brep.m_T[first_face_east_trim_index];
      vid[3] = first_face_east_trim.m_vi[1];
      eid[3] = first_face_east_trim.m_ei;
      bRev3d[3] = (first_face_east_trim.m_bRev3d?false:true);
    }
    const ON_BrepFace* side_face = brep.NewFace(cone_srf,vid,eid,bRev3d);
    if ( side_face )
    {
      prev_face_index = side_face->m_face_index;
      if ( first_face_east_trim_index < 0 )
        first_face_east_trim_index = brep.m_L[ side_face->m_li[0] ].m_ti[1];
    }
  }

  return true;
}